

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O3

vector<User,_std::allocator<User>_> * getUsers(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  istream *piVar4;
  undefined8 *in_RDI;
  long local_2a0;
  ifstream myfile;
  anon_struct_64_2_84df61a8 local_98;
  size_type *local_58;
  string line;
  
  local_58 = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  in_RDI[2] = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  line.field_2._8_8_ = in_RDI;
  std::ifstream::ifstream((istream *)&local_2a0,"../users.txt",_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::operator<<((ostream *)&std::cerr,"couldn\'t open file");
    exit(-1);
  }
  paVar1 = &local_98.username.field_2;
  paVar2 = &local_98.password.field_2;
  while( true ) {
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_2a0 + -0x18) + (char)(istream *)&local_2a0);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_2a0,(string *)&local_58,cVar3);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::find((char *)&local_58,0x10932c,0);
    local_98.password.field_2._8_8_ = 0;
    local_98.password._M_string_length = 0;
    local_98.username.field_2._M_allocated_capacity = 0;
    local_98.username.field_2._8_8_ = 0;
    local_98.username._M_string_length = 0;
    local_98.password.field_2._M_allocated_capacity = 0;
    local_98.username._M_dataplus._M_p = (pointer)paVar1;
    local_98.password._M_dataplus._M_p = (pointer)paVar2;
    std::vector<User,_std::allocator<User>_>::emplace_back<User>
              ((vector<User,_std::allocator<User>_> *)line.field_2._8_8_,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.password._M_dataplus._M_p != paVar2) {
      operator_delete(local_98.password._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.username._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.username._M_dataplus._M_p);
    }
    std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_58);
    std::__cxx11::string::operator=
              ((string *)(*(long *)(line.field_2._8_8_ + 8) + -0x40),(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.username._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.username._M_dataplus._M_p);
    }
    std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_58);
    std::__cxx11::string::operator=
              ((string *)(*(long *)(line.field_2._8_8_ + 8) + -0x20),(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.username._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.username._M_dataplus._M_p);
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&local_2a0);
  if (local_58 != &line._M_string_length) {
    operator_delete(local_58);
  }
  return (vector<User,_std::allocator<User>_> *)line.field_2._8_8_;
}

Assistant:

vector<User> getUsers(){
    string line;
    vector<User> users;
    ifstream myfile ("../users.txt");

    if(myfile.is_open()){
        while(getline(myfile,line)){

            //get pos of comma
            int commaPos = line.find(",");

            users.push_back(User());
            //username if everything before comma and after (
            users.back().username = line.substr(1,commaPos-1);
            //password is evertyhign after the comma and space and before the )
            users.back().password = line.substr(commaPos+2,line.length() - commaPos - 3);
        }
        myfile.close();
    }
    else{
        cerr << "couldn't open file";
        exit(-1);
    }


    return users;
}